

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O0

lcp_t lcp(uchar *a,uchar *b)

{
  uchar B;
  lcp_t lStack_20;
  uchar A;
  size_t i;
  uchar *b_local;
  uchar *a_local;
  
  lStack_20 = 0;
  i = (size_t)b;
  b_local = a;
  while( true ) {
    if ((*b_local == '\0') || (*b_local != *(uchar *)i)) break;
    lStack_20 = lStack_20 + 1;
    i = i + 1;
    b_local = b_local + 1;
  }
  return lStack_20;
}

Assistant:

static lcp_t
lcp(unsigned char* a, unsigned char* b)
{
	size_t i=0;
	while (true) {
		const unsigned char A = *a++;
		const unsigned char B = *b++;
		if (A==0 or A != B) return i;
		++i;
	}
	assert(0);
	return lcp_t(-1);
}